

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int uripRead(void *context,char *buffer,int len)

{
  int iVar1;
  int iVar2;
  
  iVar1 = urip_rlen;
  iVar2 = -1;
  if (-1 < len && (buffer != (char *)0x0 && context != (void *)0x0)) {
    if (urip_rlen < len) {
      len = urip_rlen;
    }
    memcpy(buffer,context,(long)len);
    urip_rlen = iVar1 - len;
    iVar2 = len;
  }
  return iVar2;
}

Assistant:

static int
uripRead(void * context, char * buffer, int len) {
   const char *ptr = (const char *) context;

   if ((context == NULL) || (buffer == NULL) || (len < 0))
       return(-1);

   if (len > urip_rlen) len = urip_rlen;
   memcpy(buffer, ptr, len);
   urip_rlen -= len;
   return(len);
}